

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          ::hasFastAccess((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                           *)0x1efaffa);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
              hasFastAccess((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                             *)0x1efb016);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}